

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf271.c
# Opt level: O3

UINT8 ymf271_r(void *info,UINT8 offset)

{
  UINT8 UVar1;
  byte bVar2;
  undefined1 uVar3;
  uint uVar4;
  
  bVar2 = 0xff;
  if ((offset & 0xf) == 2) {
    if (*(char *)((long)info + 0x2d90) != '\0') {
      UVar1 = *(UINT8 *)((long)info + 0x2d91);
      uVar4 = *(int *)((long)info + 0x2d8c) + 1U & 0x7fffff;
      *(uint *)((long)info + 0x2d8c) = uVar4;
      if (uVar4 < *(uint *)((long)info + 0x2da0)) {
        uVar3 = *(undefined1 *)(*(long *)((long)info + 0x2d98) + (ulong)uVar4);
      }
      else {
        uVar3 = 0;
      }
      *(undefined1 *)((long)info + 0x2d91) = uVar3;
      return UVar1;
    }
  }
  else {
    if ((offset & 0xf) == 1) {
      return (UINT8)(*(ushort *)((long)info + 0x2d86) >> 4);
    }
    if ((offset & 0xf) == 0) {
      bVar2 = (*(byte *)((long)info + 0x2d86) & 0xf) << 3 | *(byte *)((long)info + 0x2d85);
    }
  }
  return bVar2;
}

Assistant:

static UINT8 ymf271_r(void *info, UINT8 offset)
{
	YMF271Chip *chip = (YMF271Chip *)info;

	switch (offset & 0xf)
	{
		case 0x0:
			return chip->status | ((chip->end_status & 0xf) << 3);

		case 0x1:
			// statusreg 2
			return chip->end_status >> 4;

		case 0x2:
		{
			UINT8 ret;
			if (!chip->ext_rw)
				return 0xff;

			ret = chip->ext_readlatch;
			chip->ext_address = (chip->ext_address + 1) & 0x7fffff;
			chip->ext_readlatch = ymf271_read_memory(chip, chip->ext_address);
			return ret;
		}

		default:
			break;
	}

	return 0xff;
}